

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O2

wstring_view __thiscall mjs::rtrim(mjs *this,wstring_view s,version ver)

{
  bool bVar1;
  mjs *__n;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar2;
  wstring_view wVar3;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_30;
  
  local_30._M_len = (size_t)this;
  local_30._M_str = (wchar_t *)s._M_len;
  do {
    __n = this;
    if (__n == (mjs *)0x0) break;
    bVar1 = is_whitespace_or_line_terminator
                      ((char16_t)((wchar_t *)s._M_len)[(long)(__n + -1)],(version)s._M_str);
    this = __n + -1;
  } while (bVar1);
  bVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                    (&local_30,0,(size_type)__n);
  wVar3._M_len = bVar2._M_len;
  wVar3._M_str = bVar2._M_str;
  return wVar3;
}

Assistant:

std::wstring_view rtrim(std::wstring_view s, version ver) {
    size_t end_pos = s.length();
    while (end_pos && is_whitespace_or_line_terminator(s[end_pos-1], ver)) {
        --end_pos;
    }
    return s.substr(0, end_pos);
}